

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,TextGenerator *generator)

{
  FastFieldValuePrinter *pFVar1;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  FieldDescriptor *in_RDI;
  undefined8 in_R8;
  FieldDescriptor *in_R9;
  string *in_stack_00000008;
  FastFieldValuePrinter *printer;
  undefined8 in_stack_ffffffffffffff48;
  int i32;
  BaseTextGenerator *this_00;
  Printer *in_stack_ffffffffffffff70;
  AlphaNum *in_stack_ffffffffffffff88;
  BaseTextGenerator local_48 [4];
  FieldDescriptor *local_28;
  undefined8 local_20;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  
  i32 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (((byte)in_RDI[5] & 1) == 0) {
    local_28 = in_R9;
    local_20 = in_R8;
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    pFVar1 = GetFieldPrinter(in_stack_ffffffffffffff70,in_RDI);
    (*pFVar1->_vptr_FastFieldValuePrinter[0xc])
              (pFVar1,local_10,(ulong)local_14,(ulong)local_18,local_20,local_28,in_stack_00000008);
  }
  else {
    FieldDescriptor::number(in_R9);
    strings::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff88,i32);
    this_00 = local_48;
    StrCat_abi_cxx11_(in_stack_ffffffffffffff88);
    BaseTextGenerator::PrintString(this_00,in_stack_00000008);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}